

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O2

void shuff_build_lut(uint64_t max_cw_len)

{
  long lVar1;
  long lVar2;
  ulong *puVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = max_cw_len - 1;
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    puVar3 = shuff_lj_base + lVar4;
    lVar5 = -1;
    if (lVar4 < -1) {
      lVar5 = lVar4;
    }
    for (; (lVar1 = lVar5, -1 < lVar4 &&
           (lVar1 = lVar4, *puVar3 < (lVar2 << 0x38) + 0xffffffffffffffU)); puVar3 = puVar3 + -1) {
      lVar4 = lVar4 + -1;
    }
    lVar4 = lVar1;
    puVar3 = (ulong *)0x0;
    if (shuff_lj_base[lVar4 + 1] <= (ulong)(lVar2 << 0x38)) {
      puVar3 = shuff_lj_base + lVar4 + 1;
    }
    shuff_lut[lVar2] = puVar3;
  }
  return;
}

Assistant:

void shuff_build_lut(uint64_t max_cw_len)
{
    uint64_t max, min; // range of left justified "i"
    int64_t i, j = max_cw_len - 1; // pointer into lj

    for (i = 0; i < SHUFF_LUT_SIZE; i++) {
        min = i << ((sizeof(uint64_t) << 3) - SHUFF_LUT_BITS);
        max = min | SHUFF_MAX_IT;

        while ((j >= 0) && (max > shuff_lj_base[j]))
            j--;

        // we know max is in range of lj[j], so check min
        if (min >= shuff_lj_base[j + 1])
            shuff_lut[i] = shuff_lj_base + j + 1;
        else
            shuff_lut[i] = NULL; //-(j+1);
    }
}